

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O0

void __thiscall
r_exec::AutoFocusController::dispatch_pred_success
          (AutoFocusController *this,_Fact *predicted_f,TPXMap *map)

{
  bool bVar1;
  pointer pvVar2;
  TPX *pTVar3;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_40
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_38
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_30
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_28
  ;
  const_iterator m;
  TPXMap *map_local;
  _Fact *predicted_f_local;
  AutoFocusController *this_local;
  
  m.super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>.
  _M_cur = (_Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
            )(_Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
              )map;
  std::__detail::
  _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_28);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
       ::begin(m.
               super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
               ._M_cur);
  std::__detail::
  _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_30,
             (_Node_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_38);
  local_28._M_cur = local_30._M_cur;
  while( true ) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
         ::end(m.
               super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
               ._M_cur);
    bVar1 = std::__detail::operator!=(&local_28,&local_40);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
                           *)&local_28);
    pTVar3 = core::P<r_exec::TPX>::operator->(&pvVar2->second);
    (*(pTVar3->super__Object)._vptr__Object[4])(pTVar3,predicted_f);
    std::__detail::
    _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
                  *)&local_28);
  }
  return;
}

Assistant:

inline void AutoFocusController::dispatch_pred_success(_Fact *predicted_f, TPXMap &map)
{
    TPXMap::const_iterator m;

    for (m = map.begin(); m != map.end(); ++m) {
        m->second->ack_pred_success(predicted_f);
    }
}